

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,texcoord3h *v)

{
  ostream *poVar1;
  texcoord3h *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = operator<<(poVar1,&v->s);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&v->t);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&v->r);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const tinyusdz::value::texcoord3h &v) {
  os << "(" << v.s << ", " << v.t << ", " << v.r << ")";
  return os;
}